

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::PrepareForIndexedDraw
          (DeviceContextGLImpl *this,VALUE_TYPE IndexType,Uint32 FirstIndexLocation,
          GLenum *GLIndexType,size_t *FirstIndexByteOffset)

{
  GLenum GVar1;
  Uint32 UVar2;
  string msg;
  
  GVar1 = TypeToGLType(IndexType);
  *GLIndexType = GVar1;
  if ((4 < GVar1 - 0x1401) || ((0x15U >> (GVar1 - 0x1401 & 0x1f) & 1) == 0)) {
    FormatString<char[23]>(&msg,(char (*) [23])"Unsupported index type");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x34c);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pIndexBuffer.m_pObject ==
      (BufferGLImpl *)0x0) {
    FormatString<char[42]>(&msg,(char (*) [42])"Index Buffer is not bound to the pipeline");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"PrepareForIndexedDraw",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x34d);
    std::__cxx11::string::~string((string *)&msg);
  }
  UVar2 = GetValueSize(IndexType);
  *FirstIndexByteOffset =
       (ulong)FirstIndexLocation * (ulong)UVar2 +
       (this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_IndexDataStartOffset;
  return;
}

Assistant:

void DeviceContextGLImpl::PrepareForIndexedDraw(VALUE_TYPE IndexType, Uint32 FirstIndexLocation, GLenum& GLIndexType, size_t& FirstIndexByteOffset)
{
    GLIndexType = TypeToGLType(IndexType);
    VERIFY(GLIndexType == GL_UNSIGNED_BYTE || GLIndexType == GL_UNSIGNED_SHORT || GLIndexType == GL_UNSIGNED_INT,
           "Unsupported index type");
    VERIFY(m_pIndexBuffer, "Index Buffer is not bound to the pipeline");
    FirstIndexByteOffset = StaticCast<size_t>(GetValueSize(IndexType) * Uint64{FirstIndexLocation} + m_IndexDataStartOffset);
}